

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat<float> *
convertGrayscale8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uint *src,int count,QList<unsigned_int> *param_4,
          QDitherInfo *param_5)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 4 != uVar2; uVar2 = uVar2 + 4) {
    fVar4 = (float)*(byte *)((long)src + uVar2) * 0.003921569;
    pfVar1 = &buffer->r + uVar2;
    *pfVar1 = fVar4;
    pfVar1[1] = fVar4;
    pfVar1[2] = fVar4;
    pfVar1[3] = 1.0;
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL convertGrayscale8To(QRgba *buffer, const uint *src, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgba::fromRgba(src[i], src[i], src[i], 255);
    return buffer;
}